

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

ssize_t trompeloeil::reporter<trompeloeil::specialized>::send
                  (int __fd,void *__buf,size_t __n,int __flags)

{
  StringRef capturedExpression;
  bool value;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  ReusableStringStream *this;
  ssize_t sVar2;
  undefined4 in_register_0000000c;
  Decomposer local_362;
  ExprLhs<bool> local_361;
  StringRef local_360;
  SourceLineInfo local_350;
  StringRef local_340;
  undefined1 local_330 [8];
  AssertionHandler catchAssertionHandler_1;
  SourceLineInfo local_2d8;
  StringRef local_2c8;
  undefined1 local_2b8 [8];
  Capturer capturer0;
  MessageStream local_288;
  string local_278;
  StringRef local_258;
  StringRef local_248;
  SourceLineInfo local_238;
  StringRef local_228;
  undefined1 local_218 [8];
  AssertionHandler catchAssertionHandler;
  __string_type failure;
  ostringstream local_1a0 [8];
  ostringstream os;
  char *msg_local;
  unsigned_long line_local;
  char *file_local;
  severity s_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (__n != 0) {
    poVar1 = std::operator<<((ostream *)local_1a0,(char *)__buf);
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,__n);
    std::operator<<(poVar1,'\n');
  }
  std::operator<<((ostream *)local_1a0,(char *)CONCAT44(in_register_0000000c,__flags));
  std::__cxx11::ostringstream::str();
  if (__fd == 0) {
    local_228 = operator____catch_sr("FAIL",4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O0/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
               ,0x2c);
    local_248.m_start = (char *)0x0;
    local_248.m_size = 0;
    Catch::StringRef::StringRef(&local_248);
    capturedExpression.m_size = local_248.m_size;
    capturedExpression.m_start = local_248.m_start;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_218,local_228,&local_238,capturedExpression,Normal);
    local_288.m_stream.m_index = 0;
    local_288.m_stream.m_oss = (ostream *)0x0;
    Catch::MessageStream::MessageStream(&local_288);
    value_00 = Catch::operator+(&catchAssertionHandler.m_resultCapture);
    this = &Catch::MessageStream::operator<<(&local_288,value_00)->m_stream;
    Catch::ReusableStringStream::str_abi_cxx11_(&local_278,this);
    Catch::StringRef::StringRef(&local_258,&local_278);
    Catch::AssertionHandler::handleMessage((AssertionHandler *)local_218,ExplicitFailure,local_258);
    std::__cxx11::string::~string((string *)&local_278);
    Catch::MessageStream::~MessageStream(&local_288);
    Catch::AssertionHandler::complete((AssertionHandler *)local_218);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_218);
  }
  else {
    local_2c8 = operator____catch_sr("CAPTURE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O0/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
               ,0x35);
    join_0x00000010_0x00000000_ = operator____catch_sr("failure",7);
    Catch::Capturer::Capturer
              ((Capturer *)local_2b8,local_2c8,&local_2d8,Info,join_0x00000010_0x00000000_);
    Catch::Capturer::captureValues<std::__cxx11::string>
              ((Capturer *)local_2b8,0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &catchAssertionHandler.m_resultCapture);
    local_340 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O0/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
               ,0x36);
    local_360 = operator____catch_sr("failure.empty()",0xf);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_330,local_340,&local_350,local_360,ContinueOnFailure);
    value = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &catchAssertionHandler.m_resultCapture);
    local_361 = Catch::operator<=<bool,_0>(&local_362,value);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_330,&local_361);
    Catch::AssertionHandler::complete((AssertionHandler *)local_330);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_330);
    Catch::Capturer::~Capturer((Capturer *)local_2b8);
  }
  std::__cxx11::string::~string((string *)&catchAssertionHandler.m_resultCapture);
  sVar2 = std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return sVar2;
}

Assistant:

inline void reporter<specialized>::send(
    severity s,
    const char* file,
    unsigned long line,
    const char* msg)
  {
    std::ostringstream os;
    if (line) os << file << ':' << line << '\n';
    os << msg;
    auto failure = os.str();
    if (s == severity::fatal)
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_FAIL(failure);
#else
      FAIL(failure);
#endif
    }
    else
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_CAPTURE(failure);
      CATCH_CHECK(failure.empty());
#else
      CAPTURE(failure);
      CHECK(failure.empty());
#endif
    }
  }